

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::predict_or_learn_greedy<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  polyprediction *preds;
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  example *peVar4;
  size_t sVar5;
  size_t i_1;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  
  data->offset = ((*(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start)->super_example_predict).ft_offset;
  peVar4 = test_adf_sequence(examples);
  if (peVar4 == (example *)0x0) {
    LEARNER::multiline_learn_or_predict<false>(base,examples,data->offset,0);
  }
  else {
    LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,0);
  }
  peVar4 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  preds = &peVar4->pred;
  pfVar2 = (peVar4->pred).scalars._end;
  pfVar3 = (peVar4->pred).scalars._begin;
  sVar5 = fill_tied((cb_explore_adf *)base,(v_array<ACTION_SCORE::action_score> *)&preds->scalars);
  uVar6 = (ulong)((long)pfVar2 - (long)pfVar3) >> 3 & 0xffffffff;
  fVar1 = data->epsilon;
  for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    (preds->a_s)._begin[uVar8].score = fVar1 / (float)uVar6;
  }
  if (data->first_only == false) {
    for (sVar7 = 0; sVar5 != sVar7; sVar7 = sVar7 + 1) {
      (preds->a_s)._begin[sVar7].score =
           (1.0 - data->epsilon) / (float)sVar5 + (preds->a_s)._begin[sVar7].score;
    }
  }
  else {
    ((preds->a_s)._begin)->score = (1.0 - data->epsilon) + ((preds->a_s)._begin)->score;
  }
  return;
}

Assistant:

void predict_or_learn_greedy(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  data.offset = examples[0]->ft_offset;
  // Explore uniform random an epsilon fraction of the time.

  if (is_learn && test_adf_sequence(examples) != nullptr)
    multiline_learn_or_predict<true>(base, examples, data.offset);
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);
  action_scores& preds = examples[0]->pred.a_s;

  uint32_t num_actions = (uint32_t)preds.size();

  size_t tied_actions = fill_tied(data, preds);

  const float prob = data.epsilon / num_actions;
  for (size_t i = 0; i < num_actions; i++) preds[i].score = prob;
  if (!data.first_only)
  {
    for (size_t i = 0; i < tied_actions; ++i) preds[i].score += (1.f - data.epsilon) / tied_actions;
  }
  else
    preds[0].score += 1.f - data.epsilon;
}